

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

TableSet * __thiscall MixedArena::alloc<wasm::TableSet>(MixedArena *this)

{
  TableSet *pTVar1;
  
  pTVar1 = (TableSet *)allocSpace(this,0x30,8);
  (pTVar1->super_SpecificExpression<(wasm::Expression::Id)46>).super_Expression._id = TableSetId;
  (pTVar1->super_SpecificExpression<(wasm::Expression::Id)46>).super_Expression.type.id = 0;
  (pTVar1->table).super_IString.str._M_len = 0;
  (pTVar1->table).super_IString.str._M_str = (char *)0x0;
  return pTVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }